

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void CTPNConst::s_gen_code_str(char *str,size_t len)

{
  CTcDataStream *in_RSI;
  ulong in_RDI;
  ulong unaff_retaddr;
  CTcDataStream *in_stack_00000008;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  CTcGenTarg *in_stack_00000020;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  
  CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
  CTcGenTarg::note_push((CTcGenTarg *)0x2d10e1);
  CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  CTcGenTarg::add_const_str
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  CTcDataStream::write4(in_RSI,in_RDI);
  return;
}

Assistant:

void CTPNConst::s_gen_code_str(const char *str, size_t len)
{
    /* write the instruction to push a constant pool string */
    G_cg->write_op(OPC_PUSHSTR);

    /* note the push */
    G_cg->note_push();

    /* 
     *   add the string to the constant pool, creating a fixup at the current
     *   code stream location 
     */
    G_cg->add_const_str(str, len, G_cs, G_cs->get_ofs());

    /* 
     *   write a placeholder address - this will be corrected by the fixup
     *   that add_const_str() created for us 
     */
    G_cs->write4(0);
}